

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

bool __thiscall
TFileNameDatabase::CompareAndCopyPathFragment(TFileNameDatabase *this,TMndxSearch *pSearch)

{
  bool bVar1;
  DWORD DVar2;
  DWORD TableIndex_00;
  byte *pbVar3;
  TGenericArray<char> *this_00;
  uchar *puVar4;
  DWORD SavePathLength;
  DWORD FragmentOffset;
  DWORD TableIndex;
  DWORD ColTableIndex;
  DWORD HiBitsIndex;
  PHASH_ENTRY pHashEntry;
  TStruct40 *pStruct40;
  TMndxSearch *pSearch_local;
  TFileNameDatabase *this_local;
  
  pHashEntry = (PHASH_ENTRY)pSearch->pStruct40;
  pStruct40 = (TStruct40 *)pSearch;
  pSearch_local = (TMndxSearch *)this;
  DVar2 = TStruct40::CalcHashValue((TStruct40 *)pHashEntry,pSearch->szSearchMask);
  _ColTableIndex =
       TGenericArray<_HASH_ENTRY>::operator[](&this->HashTable,(ulong)(DVar2 & this->HashTableMask))
  ;
  if (pHashEntry[4].NodeIndex == _ColTableIndex->NodeIndex) {
    bVar1 = IsPathFragmentSingleChar(this,_ColTableIndex);
    if (bVar1) {
      TGenericArray<char>::Insert
                ((TGenericArray<char> *)(pHashEntry + 2),(_ColTableIndex->field_2).SingleChar);
      pHashEntry[4].NextIndex = pHashEntry[4].NextIndex + 1;
    }
    else if (this->pChildDB == (TFileNameDatabase *)0x0) {
      bVar1 = TPathFragmentTable::CompareAndCopyPathFragment
                        (&this->PathFragmentTable,(TMndxSearch *)pStruct40,
                         (ulong)(_ColTableIndex->field_2).FragmentOffset);
      if (!bVar1) {
        return false;
      }
    }
    else {
      bVar1 = CompareAndCopyPathFragmentByIndex
                        (this->pChildDB,(TMndxSearch *)pStruct40,
                         (_ColTableIndex->field_2).FragmentOffset);
      if (!bVar1) {
        return false;
      }
    }
    pHashEntry[4].NodeIndex = _ColTableIndex->NextIndex;
    return true;
  }
  DVar2 = TSparseArray::GetItem0(&this->CollisionTable,pHashEntry[4].NodeIndex);
  FragmentOffset = DVar2 + 1;
  pHashEntry[4].NodeIndex = (FragmentOffset - pHashEntry[4].NodeIndex) - 1;
  TableIndex = 0xffffffff;
  do {
    bVar1 = TSparseArray::IsItemPresent(&this->CollisionTable,(ulong)FragmentOffset);
    if (!bVar1) {
      return false;
    }
    bVar1 = IsPathFragmentString(this,(ulong)pHashEntry[4].NodeIndex);
    if (bVar1) {
      TableIndex_00 = GetPathFragmentOffset2(this,&TableIndex,pHashEntry[4].NodeIndex);
      DVar2 = pHashEntry[4].NextIndex;
      if (this->pChildDB == (TFileNameDatabase *)0x0) {
        bVar1 = TPathFragmentTable::CompareAndCopyPathFragment
                          (&this->PathFragmentTable,(TMndxSearch *)pStruct40,(ulong)TableIndex_00);
        if (bVar1) {
          return true;
        }
      }
      else {
        bVar1 = CompareAndCopyPathFragmentByIndex
                          (this->pChildDB,(TMndxSearch *)pStruct40,TableIndex_00);
        if (bVar1) {
          return true;
        }
      }
      if (DVar2 != pHashEntry[4].NextIndex) {
        return false;
      }
    }
    else {
      pbVar3 = TGenericArray<unsigned_char>::operator[]
                         (&this->LoBitsTable,(ulong)pHashEntry[4].NodeIndex);
      if ((uint)*pbVar3 ==
          (int)*(char *)((long)&((pStruct40->PathStops).ItemArray)->LoBitsIndex +
                        (ulong)pHashEntry[4].NextIndex)) {
        this_00 = (TGenericArray<char> *)(pHashEntry + 2);
        puVar4 = TGenericArray<unsigned_char>::operator[]
                           (&this->LoBitsTable,(ulong)pHashEntry[4].NodeIndex);
        TGenericArray<char>::Insert(this_00,*puVar4);
        pHashEntry[4].NextIndex = pHashEntry[4].NextIndex + 1;
        return true;
      }
    }
    pHashEntry[4].NodeIndex = pHashEntry[4].NodeIndex + 1;
    FragmentOffset = FragmentOffset + 1;
  } while( true );
}

Assistant:

bool CompareAndCopyPathFragment(TMndxSearch * pSearch)
    {
        TStruct40 * pStruct40 = pSearch->pStruct40;
        PHASH_ENTRY pHashEntry;
        DWORD HiBitsIndex;
        DWORD ColTableIndex;
        DWORD TableIndex;
/*
        FILE * fp = fopen("E:\\PathFragmentTable.txt", "wt");
        if (fp != NULL)
        {
            for (DWORD i = 0; i < HashTable.ItemCount; i++)
            {
                FragOffs = HashTable[i].FragOffs;
                fprintf(fp, "%02x ('%c') %08X %08X %08X", i, (0x20 <= i && i < 0x80) ? i : 0x20, HashTable[i].ItemIndex, HashTable[i].NextIndex, FragOffs);

                if(FragOffs != 0x00800000)
                {
                    if((FragOffs & 0xFFFFFF00) == 0xFFFFFF00)
                        fprintf(fp, " '%c'", (char)(FragOffs & 0xFF));
                    else
                        fprintf(fp, " %s", &PathFragmentTable.PathFragments[FragOffs]);
                }
                fprintf(fp, "\n");
            }

            fclose(fp);
        }
*/
        // Calculate the item hash from the current char and fragment ID
        TableIndex = pStruct40->CalcHashValue(pSearch->szSearchMask) & HashTableMask;
        pHashEntry = &HashTable[TableIndex];

        // Does the hash value ID match?
        if(pStruct40->NodeIndex == pHashEntry->NodeIndex)
        {
            // If the higher 24 bits are set, then the fragment is just one letter,
            // contained directly in the table.
            if(!IsPathFragmentSingleChar(pHashEntry))
            {
                // HOTS: 1958B59
                if (pChildDB != NULL)
                {
                    if (!pChildDB->CompareAndCopyPathFragmentByIndex(pSearch, pHashEntry->ChildTableIndex))
                        return false;
                }
                else
                {
                    if (!PathFragmentTable.CompareAndCopyPathFragment(pSearch, pHashEntry->FragmentOffset))
                        return false;
                }
            }
            else
            {
                // HOTS: 1958B88
                pStruct40->PathBuffer.Insert(pHashEntry->SingleChar);
                pStruct40->PathLength++;
            }

            // HOTS: 1958BCA
            pStruct40->NodeIndex = pHashEntry->NextIndex;
            return true;
        }

        // HOTS: 1958BE5
        ColTableIndex = CollisionTable.GetItem0(pStruct40->NodeIndex) + 1;
        pStruct40->NodeIndex = (ColTableIndex - pStruct40->NodeIndex - 1);
        HiBitsIndex = CASC_INVALID_INDEX;

        // Keep searching while we have a valid collision table entry
        while(CollisionTable.IsItemPresent(ColTableIndex))
        {
            // If we have high bits in the the bit at NodeIndex is set, it means that there is fragment offset
            // If not, the byte in LoBitsTable is the character
            if(IsPathFragmentString(pStruct40->NodeIndex))
            {
                DWORD FragmentOffset = GetPathFragmentOffset2(HiBitsIndex, pStruct40->NodeIndex);
                DWORD SavePathLength = pStruct40->PathLength;   // HOTS: 1958C62

                // Do we have a child database?
                if(pChildDB != NULL)
                {
                    // HOTS: 1958CCB
                    if(pChildDB->CompareAndCopyPathFragmentByIndex(pSearch, FragmentOffset))
                        return true;
                }
                else
                {
                    // HOTS: 1958CD6
                    if(PathFragmentTable.CompareAndCopyPathFragment(pSearch, FragmentOffset))
                        return true;
                }

                // HOTS: 1958CED
                if(SavePathLength != pStruct40->PathLength)
                    return false;
            }
            else
            {
                // HOTS: 1958CFB
                if(LoBitsTable[pStruct40->NodeIndex] == pSearch->szSearchMask[pStruct40->PathLength])
                {
                    // HOTS: 1958D11
                    pStruct40->PathBuffer.Insert(LoBitsTable[pStruct40->NodeIndex]);
                    pStruct40->PathLength++;
                    return true;
                }
            }

            // HOTS: 1958D11
            pStruct40->NodeIndex++;
            ColTableIndex++;
        }

        return false;
    }